

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O1

MPP_RET mpp_node_attach(MppNode node,MppClientType type)

{
  RK_S32 *pRVar1;
  MppNodeTask *task;
  RK_S32 RVar2;
  uint uVar3;
  MppClusterServer *this;
  MppCluster *pMVar4;
  
  this = MppClusterServer::single();
  pMVar4 = MppClusterServer::get(this,type);
  uVar3 = *(uint *)((long)node + 0x48);
  if ((ulong)uVar3 != 0) {
    _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"priority < 1",
               "mpp_node_attach",0x2c5);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00156d42;
  }
  if (pMVar4 == (MppCluster *)0x0) {
    _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p","mpp_node_attach",
               0x2c6);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00156d42:
      abort();
    }
  }
  LOCK();
  pRVar1 = &pMVar4->node_id;
  RVar2 = *pRVar1;
  *pRVar1 = *pRVar1 + 1;
  UNLOCK();
  *(RK_S32 *)((long)node + 0x20) = RVar2;
  snprintf((char *)node,0x1f,"%s:%d");
  task = (MppNodeTask *)((long)node + 0x70);
  *(MppNodeTask **)((long)node + 0x70) = task;
  *(MppNodeTask **)((long)node + 0x78) = task;
  *(MppNode *)((long)node + 0x80) = node;
  *(MppNode *)((long)node + 0x88) = node;
  *(ClusterQueue **)((long)node + 0x90) = pMVar4->queue + uVar3;
  *(long *)((long)node + 0x98) = (long)node + 0x28;
  *(undefined4 *)((long)node + 0x24) = 3;
  *(undefined4 *)((long)node + 0x4c) = 1;
  LOCK();
  pMVar4->node_count = pMVar4->node_count + 1;
  UNLOCK();
  if (((byte)mpp_cluster_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_cluster","%s:%d attached %d\n",(char *)0x0,pMVar4,
               (ulong)*(uint *)((long)node + 0x20),pMVar4->node_count);
  }
  mpp_node_task_schedule_f("mpp_node_attach",task);
  if (((byte)mpp_cluster_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_cluster","%s trigger signal from %s\n",(char *)0x0,node,"mpp_node_attach");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_node_attach(MppNode node, MppClientType type)
{
    MppNodeImpl *impl = (MppNodeImpl *)node;
    MppCluster *p = MppClusterServer::single()->get(type);
    RK_U32 priority = impl->priority;
    ClusterQueue *queue = &p->queue[priority];

    mpp_assert(priority < MAX_PRIORITY);
    mpp_assert(p);

    impl->node_id = MPP_FETCH_ADD(&p->node_id, 1);

    snprintf(impl->name, sizeof(impl->name) - 1, "%s:%d", p->name, impl->node_id);

    mpp_node_task_attach(&impl->task, impl, queue, &impl->work);

    MPP_FETCH_ADD(&p->node_count, 1);

    cluster_dbg_flow("%s:%d attached %d\n", p->name, impl->node_id, p->node_count);

    /* attach and run once first */
    mpp_node_task_schedule(&impl->task);
    cluster_dbg_flow("%s trigger signal from %s\n", impl->name, __FUNCTION__);

    return MPP_OK;
}